

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Conditional::Conditional
          (Conditional *this,LocationRange *lr,Fodder *open_fodder,AST *cond,Fodder *then_fodder,
          AST *branch_true,Fodder *else_fodder,AST *branch_false)

{
  AST *in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  LocationRange *in_R8;
  pointer in_R9;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  pointer in_stack_00000010;
  Fodder *in_stack_ffffffffffffffc8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_> *__x;
  
  __x = in_RDI;
  AST::AST(in_RCX,in_R8,(ASTType)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
  (in_RDI->
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Conditional_003d38c0;
  in_RDI[5].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[6].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_R9;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[8].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_00000010;
  return;
}

Assistant:

Conditional(const LocationRange &lr, const Fodder &open_fodder, AST *cond,
                const Fodder &then_fodder, AST *branch_true, const Fodder &else_fodder,
                AST *branch_false)
        : AST(lr, AST_CONDITIONAL, open_fodder),
          cond(cond),
          thenFodder(then_fodder),
          branchTrue(branch_true),
          elseFodder(else_fodder),
          branchFalse(branch_false)
    {
    }